

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::dfsForRandomIterative(Graph *this)

{
  ulong uVar1;
  ulong *puVar2;
  pointer pvVar3;
  pointer pEVar4;
  pointer puVar5;
  Tree *pTVar6;
  _Map_pointer ppNVar7;
  result_type_conflict rVar8;
  _Map_pointer ppTVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  _Map_pointer ppTVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  _Map_pointer ppTVar17;
  _Map_pointer ppNVar18;
  ulong uVar19;
  uint64_t uVar20;
  ulong local_148;
  Tree *local_140;
  _Map_pointer local_138;
  _Map_pointer local_130;
  Tree *local_128;
  Tree *local_120;
  Tree *local_118;
  Tree *local_110;
  stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_> local_108;
  Graph *local_b8;
  Tree *local_b0;
  value_type local_a8;
  long local_98;
  ulong local_90;
  long local_88;
  stack<Node,_std::deque<Node,_std::allocator<Node>_>_> local_80;
  
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 8;
  local_130 = (_Map_pointer)operator_new(0x40);
  ppTVar17 = local_130 + 3;
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data._M_map =
       local_130;
  local_140 = (Tree *)operator_new(0x200);
  *ppTVar17 = local_140;
  local_128 = local_140 + 0x20;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 8;
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data._M_start
  ._M_cur = local_140;
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data._M_start
  ._M_first = local_140;
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data._M_start
  ._M_last = local_128;
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data._M_start
  ._M_node = ppTVar17;
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = local_140;
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = local_140;
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = local_128;
  local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = ppTVar17;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)operator_new(0x40);
  ppNVar18 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_map + 3;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)operator_new(0x200);
  *ppNVar18 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur + 0x20;
  local_a8.vertex = 0;
  local_a8.start = 0;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = ppNVar18;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_cur = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_first = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_last = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_node = ppNVar18;
  std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::push(&local_80,&local_a8);
  *(this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
   super__Vector_impl_data._M_start = Grey;
  local_148 = 8;
  local_138 = ppTVar17;
  local_120 = local_140;
  local_118 = local_128;
  local_110 = local_140;
  local_b8 = this;
  local_b0 = local_140;
  do {
    ppNVar7 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    pTVar6 = local_b0;
    if (local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur) {
      while (local_120 != pTVar6) {
        if (local_120 == local_140) {
          ppTVar17 = local_138 + -1;
          uVar15 = local_138[-1][0x1f].vertex;
          uVar20 = local_138[-1][0x1f].edge;
          operator_delete(local_140,0x200);
          local_140 = local_138[-1];
          local_128 = local_140 + 0x20;
          local_120 = local_140 + 0x1f;
          this = local_b8;
        }
        else {
          uVar15 = local_120[-1].vertex;
          uVar20 = local_120[-1].edge;
          local_120 = local_120 + -1;
          ppTVar17 = local_138;
        }
        pEVar4 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl
                 .super__Vector_impl_data._M_start;
        puVar5 = (this->sums).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar19 = puVar5[uVar15];
        pEVar4[uVar20].shift = uVar19;
        puVar5[pEVar4[uVar20].super_LightEdge.v] = puVar5[pEVar4[uVar20].super_LightEdge.v] ^ uVar19
        ;
        puVar5[pEVar4[uVar20].super_LightEdge.u] =
             puVar5[pEVar4[uVar20].super_LightEdge.u] ^ pEVar4[uVar20].shift;
        local_138 = ppTVar17;
      }
      local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_first = local_140;
      local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_last = local_128;
      local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur = local_120;
      local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node = local_138;
      std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::~stack(&local_80);
      std::stack<Tree,_std::deque<Tree,_std::allocator<Tree>_>_>::~stack(&local_108);
      return;
    }
    if (local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first) {
      ppNVar18 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node + -1;
      uVar15 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1][0x1f].vertex;
      uVar19 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1][0x1f].start;
      operator_delete(local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first,0x200);
      local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_first = ppNVar7[-1];
      local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_last =
           local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_first + 0x20;
      local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur =
           local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_first + 0x1f;
      local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node = ppNVar18;
    }
    else {
      uVar15 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur[-1].vertex;
      uVar19 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur[-1].start;
      local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur =
           local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur + -1;
    }
    while (pvVar3 = (this->matrix).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar13 = *(long *)&pvVar3[uVar15].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl,
          uVar19 < (ulong)((long)*(pointer *)
                                  ((long)&pvVar3[uVar15].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl + 8) - lVar13 >> 3)) {
      uVar20 = *(uint64_t *)(lVar13 + uVar19 * 8);
      pEVar4 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = pEVar4[uVar20].super_LightEdge.u;
      if (uVar16 == uVar15) {
        uVar16 = pEVar4[uVar20].super_LightEdge.v;
      }
      if (pEVar4[uVar20].finished == false) {
        pEVar4[uVar20].finished = true;
        if ((local_b8->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar16] != White) {
          rVar8 = std::uniform_int_distribution<unsigned_long>::operator()(&rand,&engine);
          pEVar4[uVar20].shift = rVar8;
          puVar5 = (local_b8->sums).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar2 = puVar5 + uVar16;
          *puVar2 = *puVar2 ^ rVar8;
          puVar2 = puVar5 + uVar15;
          *puVar2 = *puVar2 ^ pEVar4[uVar20].shift;
          goto LAB_0010340e;
        }
        ppTVar14 = ppTVar17;
        if (local_120 == local_128 + -1) {
          lVar13 = (long)local_138 - (long)ppTVar17 >> 3;
          if (((long)local_118 - (long)local_b0 >> 4) + ((long)local_120 - (long)local_140 >> 4) +
              (lVar13 + -1 + (ulong)(local_138 == (_Map_pointer)0x0)) * 0x20 == 0x7ffffffffffffff) {
            local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur = local_120;
            local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last = local_128;
            local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node = local_138;
            local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first = local_140;
            local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Deque_impl_data._M_start._M_last = local_118;
            local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Deque_impl_data._M_map = local_130;
            local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Deque_impl_data._M_start._M_first = local_110;
            local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Deque_impl_data._M_map_size = local_148;
            local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Deque_impl_data._M_start._M_node = ppTVar17;
            std::__throw_length_error("cannot create std::deque larger than max_size()");
          }
          if (local_148 - ((long)local_138 - (long)local_130 >> 3) < 2) {
            lVar12 = lVar13 + 1;
            if (lVar13 * 2 + 4U < local_148) {
              ppTVar14 = (_Map_pointer)
                         ((long)local_130 + (local_148 - (lVar13 + 2) & 0xfffffffffffffffe) * 4);
              if (ppTVar14 < ppTVar17) {
                sVar10 = (long)local_138 + (8 - (long)ppTVar17);
                ppTVar9 = ppTVar14;
                if (sVar10 != 0) {
LAB_001035b8:
                  memmove(ppTVar9,ppTVar17,sVar10);
                }
              }
              else {
                sVar10 = (long)local_138 + (8 - (long)ppTVar17);
                if (sVar10 != 0) {
                  ppTVar9 = (_Map_pointer)((long)ppTVar14 + (lVar12 * 8 - sVar10));
                  goto LAB_001035b8;
                }
              }
            }
            else {
              lVar11 = local_148 * 2 + (ulong)(local_148 == 0);
              uVar1 = lVar11 + 2;
              if (uVar1 >> 0x3c != 0) {
                local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur = local_120;
                local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last = local_128;
                local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node = local_138;
                local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first = local_140;
                local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
                super__Deque_impl_data._M_start._M_last = local_118;
                local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
                super__Deque_impl_data._M_map = local_130;
                local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
                super__Deque_impl_data._M_start._M_first = local_110;
                local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
                super__Deque_impl_data._M_map_size = local_148;
                local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.
                super__Deque_impl_data._M_start._M_node = ppTVar17;
                if (uVar1 >> 0x3d != 0) {
                  std::__throw_bad_array_new_length();
                }
                std::__throw_bad_alloc();
              }
              local_98 = lVar11;
              local_90 = uVar1;
              local_88 = lVar12;
              ppTVar9 = (_Map_pointer)operator_new(uVar1 * 8);
              ppTVar14 = (_Map_pointer)
                         ((long)ppTVar9 + (local_98 - lVar13 & 0xfffffffffffffffeU) * 4);
              sVar10 = (long)local_138 + (8 - (long)ppTVar17);
              if (sVar10 != 0) {
                memmove(ppTVar14,ppTVar17,sVar10);
              }
              operator_delete(local_130,local_148 << 3);
              local_148 = local_90;
              lVar12 = local_88;
              local_130 = ppTVar9;
            }
            local_110 = *ppTVar14;
            local_118 = local_110 + 0x20;
            local_138 = ppTVar14 + lVar12 + -1;
          }
          local_140 = (Tree *)operator_new(0x200);
          local_138[1] = local_140;
          local_138 = local_138 + 1;
          local_120->vertex = uVar16;
          local_120->edge = uVar20;
          local_128 = local_140 + 0x20;
          local_120 = local_140;
        }
        else {
          local_120->vertex = uVar16;
          local_120->edge = uVar20;
          local_120 = local_120 + 1;
        }
        local_a8.start = uVar19 + 1;
        local_a8.vertex = uVar15;
        std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::push(&local_80,&local_a8);
        (local_b8->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar16] = Grey;
        uVar19 = 0;
        this = local_b8;
        ppTVar17 = ppTVar14;
        uVar15 = uVar16;
      }
      else {
LAB_0010340e:
        uVar19 = uVar19 + 1;
        this = local_b8;
      }
    }
    local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = local_120;
    local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_last = local_128;
    local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_node = local_138;
    local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_first = local_140;
    local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
    _M_start._M_last = local_118;
    local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data._M_map
         = local_130;
    local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
    _M_start._M_first = local_110;
    (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
    super__Vector_impl_data._M_start[uVar15] = Black;
    local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
    _M_map_size = local_148;
    local_108.c.super__Deque_base<Tree,_std::allocator<Tree>_>._M_impl.super__Deque_impl_data.
    _M_start._M_node = ppTVar17;
  } while( true );
}

Assistant:

void Graph::dfsForRandomIterative() {
    struct Node {
        std::uint64_t vertex;
        std::uint64_t start;
    };

    struct Tree {
        std::uint64_t vertex;
        std::uint64_t edge;
    };

    std::stack<Tree> ostov;
    std::stack<Node> stack;
    stack.push({0, 0});

    colorMap[0] = Colors::Grey;
    while (!stack.empty()) {
        std::uint64_t u = stack.top().vertex;
        std::uint64_t i = stack.top().start;
        stack.pop();

        while (i < matrix[u].size()) {
            auto &e = edges[matrix[u][i]];
            std::uint64_t v = ((e.u != u) ? e.u : e.v);

            if (e.finished) {
                ++i;
                continue;
            }

            e.finished = true;
            if (colorMap[v] == Colors::White) {
                ostov.push({v, matrix[u][i]});
                stack.push({u, i + 1});

                u = v;
                colorMap[u] = Colors::Grey;
                i = 0;
            } else {
                e.shift = rand(engine);
                sums[v] ^= e.shift;
                sums[u] ^= e.shift;
                ++i;
            }
        }

        colorMap[u] = Colors::Black;
    }

    while (!ostov.empty()) {
        std::uint64_t u = ostov.top().vertex;
        std::uint64_t i = ostov.top().edge;
        ostov.pop();

        auto &e = edges[i];
        e.shift = sums[u];
        sums[e.v] ^= e.shift;
        sums[e.u] ^= e.shift;
    }
}